

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_2d625e::ValueSetter::~ValueSetter(ValueSetter *this)

{
  ~ValueSetter(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

~ValueSetter() override = default;